

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void mbc1_write_rom_shared
               (Emulator *e,u16 bank_lo_mask,int bank_hi_shift,MaskedAddress addr,u8 value)

{
  undefined4 uVar1;
  u16 bank;
  ushort uVar2;
  ulong uVar3;
  undefined6 in_register_0000000a;
  byte bank_00;
  
  uVar3 = CONCAT62(in_register_0000000a,addr) >> 0xd & 0x7ffff;
  if ((ushort)uVar3 < 4) {
    (*(code *)(&DAT_00118f38 + *(int *)(&DAT_00118f38 + uVar3 * 4)))();
    return;
  }
  bank_00 = (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
  uVar2 = (ushort)bank_00 << ((byte)bank_hi_shift & 0x1f);
  uVar1 = *(undefined4 *)&(e->state).memory_map_state.field_3;
  bank = uVar2;
  if ((e->state).memory_map_state.field_3.mbc1.bank_mode != BANK_MODE_RAM) {
    bank_00 = 0;
    bank = 0;
  }
  set_rom_bank(e,0,bank);
  set_rom_bank(e,1,bank_lo_mask & (short)uVar1 + (ushort)((char)uVar1 == '\0') & 0xff | uVar2);
  set_ext_ram_bank(e,bank_00);
  return;
}

Assistant:

static void mbc1_write_rom_shared(Emulator* e, u16 bank_lo_mask,
                                  int bank_hi_shift, MaskedAddress addr,
                                  u8 value) {
  Mbc1* mbc1 = &MMAP_STATE.mbc1;
  switch (addr >> 13) {
    case 0: /* 0000-1fff */
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
      break;
    case 1: /* 2000-3fff */
      mbc1->byte_2000_3fff = value & MBC1_ROM_BANK_LO_SELECT_MASK;
      break;
    case 2: /* 4000-5fff */
      mbc1->byte_4000_5fff = value & MBC1_BANK_HI_SELECT_MASK;
      break;
    case 3: /* 6000-7fff */
      mbc1->bank_mode = (BankMode)(value & 1);
      break;
  }

  u16 hi_bank = mbc1->byte_4000_5fff << bank_hi_shift;

  u16 rom1_bank = mbc1->byte_2000_3fff;
  if (rom1_bank == 0) {
    rom1_bank++;
  }
  rom1_bank = (rom1_bank & bank_lo_mask) | hi_bank;

  u16 rom0_bank = 0;
  u8 ext_ram_bank = 0;
  if (mbc1->bank_mode == BANK_MODE_RAM) {
    rom0_bank |= hi_bank;
    ext_ram_bank = mbc1->byte_4000_5fff;
  }

  set_rom_bank(e, 0, rom0_bank);
  set_rom_bank(e, 1, rom1_bank);
  set_ext_ram_bank(e, ext_ram_bank);
}